

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleTimeScaleDirective(Preprocessor *this,Token directive)

{
  bool bVar1;
  bool bVar2;
  strong_ordering sVar3;
  _Storage<slang::TimeScale,_true> _Var4;
  Diagnostic *this_00;
  TimeScaleDirectiveSyntax *syntax;
  SourceRange SVar5;
  TimeScaleValue precision;
  TimeScaleValue unit;
  Token slash;
  Token precisionToken;
  Token unitToken;
  Token directive_local;
  Trivia local_38;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  if (0 < (int)(this->options).languageVersion) {
    checkOutsideDesignElement(this,directive);
  }
  Token::Token(&unitToken);
  Token::Token(&precisionToken);
  unit.unit = Nanoseconds;
  unit.magnitude = One;
  precision.unit = Nanoseconds;
  precision.magnitude = One;
  bVar1 = expectTimeScaleSpecifier(this,&unitToken,&unit);
  slash = expect(this,Slash);
  bVar2 = expectTimeScaleSpecifier(this,&precisionToken,&precision);
  if ((bVar1) || (bVar2)) {
    sVar3 = TimeScaleValue::operator<=>(&precision,&unit);
    if (sVar3._M_value < '\x01') {
      _Var4._M_value.precision = precision;
      _Var4._M_value.base = unit;
      if ((this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
        (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
      }
      (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload = _Var4;
    }
    else {
      SVar5 = Token::range(&precisionToken);
      this_00 = addDiag(this,(DiagCode)0xe0004,SVar5);
      SVar5 = Token::range(&unitToken);
      Diagnostic::operator<<(this_00,SVar5);
    }
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::TimeScaleDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&unitToken,&slash,&precisionToken);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleTimeScaleDirective(Token directive) {
    if (options.languageVersion >= LanguageVersion::v1800_2023)
        checkOutsideDesignElement(directive);

    Token unitToken, precisionToken;
    TimeScaleValue unit, precision;
    bool success = expectTimeScaleSpecifier(unitToken, unit);

    auto slash = expect(TokenKind::Slash);
    success |= expectTimeScaleSpecifier(precisionToken, precision);

    if (success) {
        // Precision must be equal to or smaller than the unit (i.e. more precise).
        if (precision > unit) {
            auto& diag = addDiag(diag::InvalidTimeScalePrecision, precisionToken.range());
            diag << unitToken.range();
        }
        else {
            activeTimeScale = {unit, precision};
        }
    }

    auto timeScale = alloc.emplace<TimeScaleDirectiveSyntax>(directive, unitToken, slash,
                                                             precisionToken);
    return Trivia(TriviaKind::Directive, timeScale);
}